

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O2

void __thiscall
Diligent::FixedBlockMemoryAllocator::MemoryPage::dbgVerifyAddress(MemoryPage *this,void *pBlockAddr)

{
  FixedBlockMemoryAllocator *pFVar1;
  ulong uVar2;
  ulong uVar3;
  string msg;
  
  uVar2 = (long)pBlockAddr - (long)this->m_pPageStart;
  pFVar1 = this->m_pOwnerAllocator;
  uVar3 = pFVar1->m_BlockSize;
  if (uVar2 % uVar3 != 0) {
    FormatString<char[16]>(&msg,(char (*) [16])"Invalid address");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"dbgVerifyAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x5d);
    std::__cxx11::string::~string((string *)&msg);
    pFVar1 = this->m_pOwnerAllocator;
    uVar3 = pFVar1->m_BlockSize;
  }
  if (pFVar1->m_NumBlocksInPage <= (uint)(uVar2 / uVar3)) {
    FormatString<char[20]>(&msg,(char (*) [20])"Invalid block index");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"dbgVerifyAddress",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x5f);
    std::__cxx11::string::~string((string *)&msg);
  }
  return;
}

Assistant:

void FixedBlockMemoryAllocator::MemoryPage::dbgVerifyAddress(const void* pBlockAddr) const
{
    size_t Delta = reinterpret_cast<const Uint8*>(pBlockAddr) - reinterpret_cast<Uint8*>(m_pPageStart);
    VERIFY(Delta % m_pOwnerAllocator->m_BlockSize == 0, "Invalid address");
    Uint32 BlockIndex = static_cast<Uint32>(Delta / m_pOwnerAllocator->m_BlockSize);
    VERIFY(BlockIndex < m_pOwnerAllocator->m_NumBlocksInPage, "Invalid block index");
}